

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# P2PFileReceiver.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  undefined8 *in_RSI;
  int in_EDI;
  SDKJsonResult result;
  shared_ptr<FileReceiverServerConnection> connection;
  P2PFileReceiver receiver;
  char *exe;
  string hostname;
  LogStringBuffer buffer;
  LogStringBuffer buffer_1;
  LogStringBuffer buffer_2;
  LogStringBuffer buffer_3;
  LogStringBuffer buffer_4;
  LogStringBuffer buffer_5;
  LogStringBuffer buffer_6;
  LogStringBuffer buffer_7;
  SDKJsonResult *in_stack_ffffffffffffe678;
  LogStringBuffer *in_stack_ffffffffffffe680;
  P2PFileReceiver **in_stack_ffffffffffffe6a8;
  Channel *pCVar2;
  LogStringBuffer *in_stack_ffffffffffffe6b8;
  Channel *pCVar3;
  OutputWorker *in_stack_ffffffffffffe6c0;
  P2PFileReceiver *in_stack_ffffffffffffe718;
  char *local_1820;
  string local_1790 [32];
  SDKResult local_1770 [10];
  undefined1 *local_1748;
  __shared_ptr<FileReceiverServerConnection,_(__gnu_cxx::_Lock_policy)2> local_1730;
  undefined1 local_1720 [144];
  char *local_1690 [3];
  allocator local_1671;
  string local_1670 [32];
  undefined8 *local_1650;
  int local_1648;
  int local_1644;
  char *local_1640;
  undefined2 *local_1638;
  char *local_1630;
  string *local_1628;
  char *local_1620;
  Channel *local_1618;
  char *local_1610;
  undefined8 *local_1608;
  char *local_1600;
  Channel *local_15f8;
  char *local_15f0;
  Channel *local_15e8;
  char *local_15e0;
  Channel *local_15d8;
  char *local_15d0;
  string *local_15c8;
  char *local_15c0;
  Channel *local_15b8;
  char *local_15b0;
  Channel *local_15a8;
  char *local_15a0;
  Channel *local_1598;
  char *local_1590;
  Channel *local_1588;
  char *local_1580;
  undefined2 *local_1578;
  char *local_1570;
  string *local_1568;
  char *local_1560;
  undefined4 local_1554;
  Channel *local_1550;
  undefined4 local_1544;
  Channel *local_1540;
  ostream aoStack_1518 [94];
  uint16_t in_stack_ffffffffffffeb46;
  string *in_stack_ffffffffffffeb48;
  SDKConnection *in_stack_ffffffffffffeb50;
  SDKSocket *in_stack_ffffffffffffeb58;
  undefined1 local_1140 [16];
  ostream aoStack_1130 [376];
  char *local_fb8;
  undefined8 *local_fb0;
  char *local_fa8;
  undefined4 local_f9c;
  Channel *local_f98;
  char *local_f90;
  undefined8 *local_f88;
  char *local_f80;
  undefined8 local_f78;
  undefined1 *local_f70;
  Channel *local_f68;
  undefined8 local_f60;
  undefined1 *local_f58;
  Channel *local_f50;
  undefined8 local_f48;
  undefined1 *local_f40;
  char *local_f38;
  undefined8 *local_f30;
  char *local_f28;
  undefined1 *local_f20;
  Channel *local_f18;
  char *local_f10;
  undefined1 *local_f08;
  Channel *local_f00;
  char *local_ef8;
  undefined8 *local_ef0;
  undefined1 *local_ee8;
  Channel *local_ee0;
  char *local_ed8;
  undefined1 *local_ed0;
  Channel *local_ec8;
  char *local_ec0;
  undefined1 *local_eb8;
  undefined8 *local_eb0;
  undefined1 *local_ea8;
  Channel *local_ea0;
  undefined8 *local_e98;
  undefined1 *local_e90;
  char *local_e88;
  undefined1 *local_e80;
  char *local_e78;
  undefined4 local_e6c;
  Channel *local_e68;
  undefined4 local_e5c;
  Channel *local_e58;
  undefined1 local_e40 [16];
  ostream aoStack_e30 [376];
  char *local_cb8;
  undefined4 local_cac;
  Channel *local_ca8;
  char *local_ca0;
  undefined8 local_c98;
  undefined1 *local_c90;
  Channel *local_c88;
  undefined8 local_c80;
  undefined1 *local_c78;
  Channel *local_c70;
  undefined8 local_c68;
  undefined1 *local_c60;
  char *local_c58;
  undefined1 *local_c50;
  Channel *local_c48;
  char *local_c40;
  undefined1 *local_c38;
  char *local_c30;
  undefined4 local_c24;
  Channel *local_c20;
  undefined4 local_c14;
  Channel *local_c10;
  undefined1 local_bf8 [16];
  ostream aoStack_be8 [376];
  char *local_a70;
  undefined4 local_a64;
  Channel *local_a60;
  char *local_a58;
  undefined8 local_a50;
  undefined1 *local_a48;
  Channel *local_a40;
  undefined8 local_a38;
  undefined1 *local_a30;
  Channel *local_a28;
  undefined8 local_a20;
  undefined1 *local_a18;
  char *local_a10;
  undefined1 *local_a08;
  Channel *local_a00;
  char *local_9f8;
  undefined1 *local_9f0;
  char *local_9e8;
  string *local_9e0;
  char *local_9d8;
  undefined4 local_9cc;
  Channel *local_9c8;
  undefined4 local_9bc;
  Channel *local_9b8;
  undefined1 local_9a0 [16];
  ostream aoStack_990 [376];
  char *local_818;
  string *local_810;
  char *local_808;
  undefined4 local_7fc;
  Channel *local_7f8;
  char *local_7f0;
  string *local_7e8;
  char *local_7e0;
  undefined8 local_7d8;
  undefined1 *local_7d0;
  Channel *local_7c8;
  undefined8 local_7c0;
  undefined1 *local_7b8;
  Channel *local_7b0;
  undefined8 local_7a8;
  undefined1 *local_7a0;
  char *local_798;
  string *local_790;
  char *local_788;
  undefined1 *local_780;
  Channel *local_778;
  char *local_770;
  undefined1 *local_768;
  Channel *local_760;
  char *local_758;
  undefined1 *local_750;
  char *local_748;
  string *local_740;
  undefined1 *local_738;
  Channel *local_730;
  string *local_728;
  undefined1 *local_720;
  Channel *local_718;
  string *local_710;
  undefined1 *local_708;
  char *local_700;
  undefined1 *local_6f8;
  Channel *local_6f0;
  char *local_6e8;
  undefined1 *local_6e0;
  char *local_6d8;
  undefined4 local_6cc;
  Channel *local_6c8;
  undefined4 local_6bc;
  Channel *local_6b8;
  undefined1 local_6a0 [16];
  ostream aoStack_690 [376];
  char *local_518;
  undefined4 local_50c;
  Channel *local_508;
  char *local_500;
  undefined8 local_4f8;
  undefined1 *local_4f0;
  Channel *local_4e8;
  undefined8 local_4e0;
  undefined1 *local_4d8;
  Channel *local_4d0;
  undefined8 local_4c8;
  undefined1 *local_4c0;
  char *local_4b8;
  undefined1 *local_4b0;
  Channel *local_4a8;
  char *local_4a0;
  undefined1 *local_498;
  char *local_490;
  undefined4 local_484;
  Channel *local_480;
  undefined4 local_474;
  Channel *local_470;
  undefined1 local_458 [16];
  ostream aoStack_448 [376];
  char *local_2d0;
  undefined4 local_2c4;
  Channel *local_2c0;
  char *local_2b8;
  undefined8 local_2b0;
  undefined1 *local_2a8;
  Channel *local_2a0;
  undefined8 local_298;
  undefined1 *local_290;
  Channel *local_288;
  undefined8 local_280;
  undefined1 *local_278;
  char *local_270;
  undefined1 *local_268;
  Channel *local_260;
  char *local_258;
  undefined1 *local_250;
  char *local_248;
  undefined4 local_23c;
  Channel *local_238;
  undefined4 local_22c;
  Channel *local_228;
  undefined1 local_210 [16];
  ostream aoStack_200 [376];
  char *local_88;
  undefined4 local_7c;
  Channel *local_78;
  char *local_70;
  undefined8 local_68;
  undefined1 *local_60;
  Channel *local_58;
  undefined8 local_50;
  undefined1 *local_48;
  Channel *local_40;
  undefined8 local_38;
  undefined1 *local_30;
  char *local_28;
  undefined1 *local_20;
  Channel *local_18;
  char *local_10;
  undefined1 *local_8;
  
  local_1644 = 0;
  local_1650 = in_RSI;
  local_1648 = in_EDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1670,"127.0.0.1",&local_1671);
  std::allocator<char>::~allocator((allocator<char> *)&local_1671);
  if (local_1648 < 2) {
    if (local_1648 < 1) {
      local_1820 = "P2PFileSender";
    }
    else {
      local_1820 = (char *)*local_1650;
    }
    local_1690[0] = local_1820;
    local_15f8 = &Logger;
    local_1600 = "Usage: ";
    local_1608 = local_1690;
    local_1610 = " <Rendezvous Server Hostname>";
    if ((int)Logger.ChannelMinLevel < 3) {
      local_f98 = &Logger;
      local_f9c = 2;
      local_fa8 = "Usage: ";
      local_fb8 = " <Rendezvous Server Hostname>";
      local_fb0 = local_1608;
      logger::LogStringBuffer::LogStringBuffer
                (in_stack_ffffffffffffe680,(char *)in_stack_ffffffffffffe678,Trace);
      local_f78 = 0x119318;
      local_f68 = &Logger;
      local_f70 = local_1140;
      local_f80 = local_fa8;
      local_f88 = local_fb0;
      local_f90 = local_fb8;
      local_f50 = &Logger;
      local_f60 = local_f78;
      local_f58 = local_f70;
      local_f48 = local_f78;
      local_f40 = local_f70;
      std::operator<<(aoStack_1130,(string *)&Logger.Prefix);
      local_f18 = &Logger;
      local_f20 = local_f70;
      local_f28 = local_f80;
      local_f30 = local_f88;
      local_f38 = local_f90;
      local_f00 = &Logger;
      local_f08 = local_f70;
      local_f10 = local_f80;
      local_e80 = local_f70;
      local_e88 = local_f80;
      std::operator<<((ostream *)(local_f70 + 0x10),local_f80);
      local_ee0 = &Logger;
      local_ee8 = local_f20;
      local_ef0 = local_f30;
      local_ef8 = local_f38;
      local_ea0 = &Logger;
      local_ea8 = local_f20;
      local_eb0 = local_f30;
      local_e90 = local_f20;
      local_e98 = local_f30;
      std::operator<<((ostream *)(local_f20 + 0x10),(char *)*local_f30);
      local_ec8 = &Logger;
      local_ed0 = local_ee8;
      local_ed8 = local_ef8;
      local_eb8 = local_ee8;
      local_ec0 = local_ef8;
      std::operator<<((ostream *)(local_ee8 + 0x10),local_ef8);
      logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write(in_stack_ffffffffffffe6c0,in_stack_ffffffffffffe6b8);
      logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x108e38);
    }
  }
  else {
    std::__cxx11::string::operator=(local_1670,(char *)local_1650[1]);
    local_1618 = &Logger;
    local_1620 = "Server hostname: ";
    local_1630 = ", port: ";
    local_1638 = &kFileRendezvousServerPort;
    local_1640 = " - Also broadcasting on the LAN to find server";
    local_1550 = &Logger;
    local_1554 = 2;
    local_1560 = "Server hostname: ";
    local_1570 = ", port: ";
    local_1578 = &kFileRendezvousServerPort;
    local_1580 = " - Also broadcasting on the LAN to find server";
    local_1540 = &Logger;
    local_1544 = 2;
    local_1628 = local_1670;
    local_1568 = local_1670;
    if ((int)Logger.ChannelMinLevel < 3) {
      logger::LogStringBuffer::LogStringBuffer
                (in_stack_ffffffffffffe680,(char *)in_stack_ffffffffffffe678,Trace);
      std::operator<<(aoStack_1518,(string *)&Logger.Prefix);
      std::operator<<(aoStack_1518,"Server hostname: ");
      std::operator<<(aoStack_1518,local_1670);
      std::operator<<(aoStack_1518,", port: ");
      std::ostream::operator<<(aoStack_1518,0x285e);
      std::operator<<(aoStack_1518," - Also broadcasting on the LAN to find server");
      logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write(in_stack_ffffffffffffe6c0,in_stack_ffffffffffffe6b8);
      logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x1088ba);
    }
  }
  P2PFileReceiver::P2PFileReceiver((P2PFileReceiver *)in_stack_ffffffffffffe680);
  bVar1 = P2PFileReceiver::Initialize(in_stack_ffffffffffffe718);
  if (bVar1) {
    local_15e8 = &Logger;
    local_15f0 = "File sending client started";
    local_e68 = &Logger;
    local_e6c = 1;
    local_e78 = "File sending client started";
    local_e58 = &Logger;
    local_e5c = 1;
    if ((int)Logger.ChannelMinLevel < 2) {
      local_ca8 = &Logger;
      local_cac = 1;
      local_cb8 = "File sending client started";
      logger::LogStringBuffer::LogStringBuffer
                (in_stack_ffffffffffffe680,(char *)in_stack_ffffffffffffe678,Trace);
      local_c98 = 0x119318;
      local_c88 = &Logger;
      local_c90 = local_e40;
      local_ca0 = local_cb8;
      local_c70 = &Logger;
      local_c80 = local_c98;
      local_c78 = local_c90;
      local_c68 = local_c98;
      local_c60 = local_c90;
      std::operator<<(aoStack_e30,(string *)&Logger.Prefix);
      local_c48 = &Logger;
      local_c50 = local_c90;
      local_c58 = local_ca0;
      local_c38 = local_c90;
      local_c40 = local_ca0;
      std::operator<<((ostream *)(local_c90 + 0x10),local_ca0);
      logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write(in_stack_ffffffffffffe6c0,in_stack_ffffffffffffe6b8);
      logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x1090ea);
    }
  }
  else {
    local_15d8 = &Logger;
    local_15e0 = "File sending server failed to start";
    local_c20 = &Logger;
    local_c24 = 1;
    local_c30 = "File sending server failed to start";
    local_c10 = &Logger;
    local_c14 = 1;
    if ((int)Logger.ChannelMinLevel < 2) {
      local_a60 = &Logger;
      local_a64 = 1;
      local_a70 = "File sending server failed to start";
      logger::LogStringBuffer::LogStringBuffer
                (in_stack_ffffffffffffe680,(char *)in_stack_ffffffffffffe678,Trace);
      local_a50 = 0x119318;
      local_a40 = &Logger;
      local_a48 = local_bf8;
      local_a58 = local_a70;
      local_a28 = &Logger;
      local_a38 = local_a50;
      local_a30 = local_a48;
      local_a20 = local_a50;
      local_a18 = local_a48;
      std::operator<<(aoStack_be8,(string *)&Logger.Prefix);
      local_a00 = &Logger;
      local_a08 = local_a48;
      local_a10 = local_a58;
      local_9f0 = local_a48;
      local_9f8 = local_a58;
      std::operator<<((ostream *)(local_a48 + 0x10),local_a58);
      logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write(in_stack_ffffffffffffe6c0,in_stack_ffffffffffffe6b8);
      logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x1093c6);
    }
  }
  std::shared_ptr<FileReceiverServerConnection>::shared_ptr
            ((shared_ptr<FileReceiverServerConnection> *)0x1093db);
  local_1748 = local_1720;
  std::make_shared<FileReceiverServerConnection,P2PFileReceiver*>(in_stack_ffffffffffffe6a8);
  std::shared_ptr<FileReceiverServerConnection>::operator=
            ((shared_ptr<FileReceiverServerConnection> *)in_stack_ffffffffffffe680,
             (shared_ptr<FileReceiverServerConnection> *)in_stack_ffffffffffffe678);
  std::shared_ptr<FileReceiverServerConnection>::~shared_ptr
            ((shared_ptr<FileReceiverServerConnection> *)0x109434);
  std::__shared_ptr<FileReceiverServerConnection,_(__gnu_cxx::_Lock_policy)2>::get(&local_1730);
  tonk::SDKSocket::Connect
            (in_stack_ffffffffffffeb58,in_stack_ffffffffffffeb50,in_stack_ffffffffffffeb48,
             in_stack_ffffffffffffeb46);
  bVar1 = tonk::SDKResult::Failed(local_1770);
  if (bVar1) {
    tonk::SDKJsonResult::ToString_abi_cxx11_(in_stack_ffffffffffffe678);
    local_15b8 = &Logger;
    local_15c0 = "Client connection failed: ";
    local_15c8 = local_1790;
    local_15d0 = " - Going to advertise on the LAN looking for connections";
    local_9c8 = &Logger;
    local_9cc = 2;
    local_9d8 = "Client connection failed: ";
    local_9e8 = " - Going to advertise on the LAN looking for connections";
    local_9b8 = &Logger;
    local_9bc = 2;
    local_9e0 = local_15c8;
    if ((int)Logger.ChannelMinLevel < 3) {
      local_7f8 = &Logger;
      local_7fc = 2;
      local_808 = "Client connection failed: ";
      local_818 = " - Going to advertise on the LAN looking for connections";
      local_810 = local_15c8;
      logger::LogStringBuffer::LogStringBuffer
                (in_stack_ffffffffffffe680,(char *)in_stack_ffffffffffffe678,Trace);
      local_7d8 = 0x119318;
      local_7c8 = &Logger;
      local_7d0 = local_9a0;
      local_7e0 = local_808;
      local_7e8 = local_810;
      local_7f0 = local_818;
      pCVar3 = &Logger;
      local_7b0 = &Logger;
      local_7c0 = local_7d8;
      local_7b8 = local_7d0;
      local_7a8 = local_7d8;
      local_7a0 = local_7d0;
      std::operator<<(aoStack_990,(string *)&Logger.Prefix);
      local_780 = local_7d0;
      local_788 = local_7e0;
      local_790 = local_7e8;
      local_798 = local_7f0;
      local_768 = local_7d0;
      local_770 = local_7e0;
      local_750 = local_7d0;
      local_758 = local_7e0;
      local_778 = pCVar3;
      local_760 = pCVar3;
      std::operator<<((ostream *)(local_7d0 + 0x10),local_7e0);
      local_738 = local_780;
      local_740 = local_790;
      local_748 = local_798;
      local_720 = local_780;
      local_728 = local_790;
      local_708 = local_780;
      local_710 = local_790;
      local_730 = pCVar3;
      local_718 = pCVar3;
      std::operator<<((ostream *)(local_780 + 0x10),local_790);
      local_6f8 = local_738;
      local_700 = local_748;
      local_6e0 = local_738;
      local_6e8 = local_748;
      local_6f0 = pCVar3;
      std::operator<<((ostream *)(local_738 + 0x10),local_748);
      logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write(in_stack_ffffffffffffe6c0,in_stack_ffffffffffffe6b8);
      logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x109911);
    }
    std::__cxx11::string::~string(local_1790);
  }
  tonk::SDKJsonResult::~SDKJsonResult((SDKJsonResult *)0x1099bc);
  getchar();
  local_15a8 = &Logger;
  local_15b0 = "Client shutdown";
  local_6c8 = &Logger;
  local_6cc = 1;
  local_6d8 = "Client shutdown";
  local_6b8 = &Logger;
  local_6bc = 1;
  if ((int)Logger.ChannelMinLevel < 2) {
    local_508 = &Logger;
    local_50c = 1;
    local_518 = "Client shutdown";
    logger::LogStringBuffer::LogStringBuffer
              (in_stack_ffffffffffffe680,(char *)in_stack_ffffffffffffe678,Trace);
    local_4f8 = 0x119318;
    local_4e8 = &Logger;
    local_4f0 = local_6a0;
    local_500 = local_518;
    local_4d0 = &Logger;
    local_4e0 = local_4f8;
    local_4d8 = local_4f0;
    local_4c8 = local_4f8;
    local_4c0 = local_4f0;
    std::operator<<(aoStack_690,(string *)&Logger.Prefix);
    local_4a8 = &Logger;
    local_4b0 = local_4f0;
    local_4b8 = local_500;
    local_498 = local_4f0;
    local_4a0 = local_500;
    std::operator<<((ostream *)(local_4f0 + 0x10),local_500);
    in_stack_ffffffffffffe6c0 = logger::OutputWorker::GetInstance();
    logger::OutputWorker::Write(in_stack_ffffffffffffe6c0,in_stack_ffffffffffffe6b8);
    logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x109c1d);
  }
  std::shared_ptr<FileReceiverServerConnection>::~shared_ptr
            ((shared_ptr<FileReceiverServerConnection> *)0x109c30);
  P2PFileReceiver::~P2PFileReceiver((P2PFileReceiver *)0x109c3d);
  local_1598 = &Logger;
  local_15a0 = "Press ENTER key to terminate";
  local_480 = &Logger;
  local_484 = 1;
  local_490 = "Press ENTER key to terminate";
  pCVar3 = &Logger;
  local_470 = &Logger;
  local_474 = 1;
  if ((int)Logger.ChannelMinLevel < 2) {
    local_2c0 = &Logger;
    local_2c4 = 1;
    local_2d0 = "Press ENTER key to terminate";
    logger::LogStringBuffer::LogStringBuffer
              (in_stack_ffffffffffffe680,(char *)in_stack_ffffffffffffe678,Trace);
    local_2b0 = 0x119318;
    local_2a0 = &Logger;
    local_2a8 = local_458;
    local_2b8 = local_2d0;
    pCVar2 = &Logger;
    local_288 = &Logger;
    local_298 = local_2b0;
    local_290 = local_2a8;
    local_280 = local_2b0;
    local_278 = local_2a8;
    std::operator<<(aoStack_448,(string *)&Logger.Prefix);
    local_268 = local_2a8;
    local_270 = local_2b8;
    local_250 = local_2a8;
    local_258 = local_2b8;
    local_260 = pCVar2;
    std::operator<<((ostream *)(local_2a8 + 0x10),local_2b8);
    logger::OutputWorker::GetInstance();
    logger::OutputWorker::Write(in_stack_ffffffffffffe6c0,(LogStringBuffer *)pCVar3);
    logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x109e9d);
  }
  getchar();
  local_1588 = &Logger;
  local_1590 = "...Key press detected.  Terminating..";
  local_238 = &Logger;
  local_23c = 1;
  local_248 = "...Key press detected.  Terminating..";
  local_228 = &Logger;
  local_22c = 1;
  if ((int)Logger.ChannelMinLevel < 2) {
    local_78 = &Logger;
    local_7c = 1;
    local_88 = "...Key press detected.  Terminating..";
    logger::LogStringBuffer::LogStringBuffer
              (in_stack_ffffffffffffe680,(char *)in_stack_ffffffffffffe678,Trace);
    local_68 = 0x119318;
    local_58 = &Logger;
    local_60 = local_210;
    local_70 = local_88;
    local_40 = &Logger;
    local_50 = local_68;
    local_48 = local_60;
    local_38 = local_68;
    local_30 = local_60;
    std::operator<<(aoStack_200,(string *)&Logger.Prefix);
    local_18 = &Logger;
    local_20 = local_60;
    local_28 = local_70;
    local_8 = local_60;
    local_10 = local_70;
    std::operator<<((ostream *)(local_60 + 0x10),local_70);
    logger::OutputWorker::GetInstance();
    logger::OutputWorker::Write(in_stack_ffffffffffffe6c0,(LogStringBuffer *)pCVar3);
    logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x10a106);
  }
  local_1644 = 0;
  std::__cxx11::string::~string(local_1670);
  return local_1644;
}

Assistant:

int main(int argc, char** argv)
{
    std::string hostname = "127.0.0.1";

    if (argc >= 2) {
        hostname = argv[1];
        Logger.Info("Server hostname: ", hostname, ", port: ", kFileRendezvousServerPort,
            " - Also broadcasting on the LAN to find server");
    }
    else
    {
        const char* exe = (argc > 0 ? argv[0] : "P2PFileSender");
        Logger.Info("Usage: ", exe, " <Rendezvous Server Hostname>");
    }

    {
        P2PFileReceiver receiver;

        if (receiver.Initialize()) {
            Logger.Debug("File sending client started");
        }
        else {
            Logger.Debug("File sending server failed to start");
        }

        std::shared_ptr<FileReceiverServerConnection> connection;

        {
            connection = std::make_shared<FileReceiverServerConnection>(&receiver);

            auto result = receiver.Connect(connection.get(), hostname, kFileRendezvousServerPort);

            if (result.Failed())
            {
                Logger.Info("Client connection failed: ", result.ToString(),
                    " - Going to advertise on the LAN looking for connections");
            }
        }

        ::getchar();

        Logger.Debug("Client shutdown");
    }

    Logger.Debug("Press ENTER key to terminate");

    ::getchar();

    Logger.Debug("...Key press detected.  Terminating..");

    return 0;
}